

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O2

void __thiscall QWhatsThisPrivate::~QWhatsThisPrivate(QWhatsThisPrivate *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  code *local_40;
  undefined8 local_38;
  QWhatsThisPrivate *pQStack_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_007c6ce0;
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&this->action);
  if (bVar1) {
    QAction::setChecked(SUB81((this->action).wp.value,0));
  }
  QGuiApplication::restoreOverrideCursor();
  local_40 = QFont::strikeOut;
  local_38 = 0xaaaaaaaa0000000d;
  local_28 = 0xaaaaaaaaffffffff;
  pQStack_30 = this;
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_40);
  instance = (QWhatsThisPrivate *)0x0;
  QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_40);
  QWeakPointer<QObject>::~QWeakPointer(&(this->action).wp);
  QObject::~QObject(&this->super_QObject);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWhatsThisPrivate::~QWhatsThisPrivate()
{
#if QT_CONFIG(action)
    if (action)
        action->setChecked(false);
#endif // QT_CONFIG(action)
#ifndef QT_NO_CURSOR
    QGuiApplication::restoreOverrideCursor();
#endif
#if QT_CONFIG(accessibility)
    QAccessibleEvent event(this, QAccessible::ContextHelpEnd);
    QAccessible::updateAccessibility(&event);
#endif
    instance = nullptr;
}